

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestCaseForTestResult
               (ostream *stream,TestResult *result)

{
  TestResult *pTVar1;
  internal *piVar2;
  TimeInMillis ms;
  TimeInMillis ms_00;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  allocator local_299;
  string local_298;
  string local_278;
  allocator local_251;
  string local_250;
  allocator local_229;
  string local_228;
  allocator local_201;
  string local_200;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  TestResult *local_18;
  TestResult *result_local;
  ostream *stream_local;
  
  local_18 = result;
  result_local = (TestResult *)stream;
  std::operator<<(stream,"    <testcase");
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"testcase",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"name",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"",&local_99);
  OutputXmlAttribute((ostream *)pTVar1,&local_38,&local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"testcase",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"status",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"run",&local_111);
  OutputXmlAttribute((ostream *)pTVar1,&local_c0,&local_e8,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"testcase",&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"result",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"completed",&local_189);
  OutputXmlAttribute((ostream *)pTVar1,&local_138,&local_160,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"testcase",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"classname",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_200,"",&local_201);
  OutputXmlAttribute((ostream *)pTVar1,&local_1b0,&local_1d8,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"testcase",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"time",&local_251);
  piVar2 = (internal *)TestResult::elapsed_time(local_18);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_278,piVar2,ms);
  OutputXmlAttribute((ostream *)pTVar1,&local_228,&local_250,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"testcase",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,"timestamp",&local_2c1);
  piVar2 = (internal *)TestResult::start_timestamp(local_18);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(&local_2e8,piVar2,ms_00);
  OutputXmlAttribute((ostream *)pTVar1,&local_298,&local_2c0,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  OutputXmlTestResult((ostream *)result_local,local_18);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestCaseForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a minimal test case with a single test.
  *stream << "    <testcase";
  OutputXmlAttribute(stream, "testcase", "name", "");
  OutputXmlAttribute(stream, "testcase", "status", "run");
  OutputXmlAttribute(stream, "testcase", "result", "completed");
  OutputXmlAttribute(stream, "testcase", "classname", "");
  OutputXmlAttribute(stream, "testcase", "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, "testcase", "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));

  // Output the actual test result.
  OutputXmlTestResult(stream, result);
}